

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

nng_err nni_http_server_start(nni_http_server *s)

{
  nng_err nVar1;
  undefined8 in_RAX;
  uint32_t local_24;
  
  local_24 = (uint32_t)((ulong)in_RAX >> 0x20);
  nni_mtx_lock(&s->mtx);
  nVar1 = NNG_OK;
  if (s->starts == 0) {
    nVar1 = nng_stream_listener_listen(s->listener);
    if (nVar1 == NNG_OK) {
      if (s->port == 0) {
        nng_stream_listener_get_int(s->listener,"tcp-bound-port",(int *)&local_24);
        s->port = local_24;
      }
      nng_stream_listener_accept(s->listener,&s->accaio);
      nVar1 = NNG_OK;
    }
  }
  if (nVar1 == NNG_OK) {
    s->starts = s->starts + 1;
  }
  nni_mtx_unlock(&s->mtx);
  return nVar1;
}

Assistant:

static nng_err
http_server_start(nni_http_server *s)
{
	nng_err rv;
	if ((rv = nng_stream_listener_listen(s->listener)) != 0) {
		return (rv);
	}
	if (s->port == 0) {
		int port;
		nng_stream_listener_get_int(
		    s->listener, NNG_OPT_TCP_BOUND_PORT, &port);
		s->port = (uint32_t) port;
	}
	nng_stream_listener_accept(s->listener, &s->accaio);
	return (NNG_OK);
}